

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O2

void __thiscall QXcbWindow::updateWmTransientFor(QXcbWindow *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  QDebug *pQVar4;
  QXcbWindow *this_00;
  long in_FS_OFFSET;
  char local_88 [24];
  char *local_70;
  QDebug local_68;
  Stream *local_60;
  undefined1 local_58 [8];
  Stream *local_50;
  undefined1 local_48 [12];
  xcb_window_t transientXcbParent;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  transientXcbParent = 0;
  QPlatformWindow::window();
  iVar1 = QWindow::type();
  if (iVar1 == 3) {
LAB_0016a794:
    QPlatformWindow::window();
    lVar2 = QWindow::transientParent();
    if (lVar2 == 0) {
LAB_0016a8d1:
      transientXcbParent =
           QXcbConnection::clientLeader((QXcbConnection *)(this->super_QXcbObject).m_connection);
      if (transientXcbParent == 0) goto LAB_0016a956;
    }
    else {
      lVar2 = QWindow::handle();
      if (lVar2 == 0) goto LAB_0016a8d1;
      lVar2 = QWindow::handle();
      this_00 = (QXcbWindow *)(lVar2 + -0x20);
      if (lVar2 == 0) {
        this_00 = (QXcbWindow *)0x0;
      }
      plVar3 = (long *)QWindow::handle();
      transientXcbParent = (**(code **)(*plVar3 + 0x68))(plVar3);
      if (transientXcbParent == 0) goto LAB_0016a8d1;
      registerWmTransientForChild(this_00,this);
      lcQpaXcbWindow();
      if (((byte)lcQpaXcbWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
         ) {
        local_88[0] = '\x02';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = '\0';
        local_88[9] = '\0';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = '\0';
        local_88[0x11] = '\0';
        local_88[0x12] = '\0';
        local_88[0x13] = '\0';
        local_88[0x14] = '\0';
        local_88[0x15] = '\0';
        local_88[0x16] = '\0';
        local_88[0x17] = '\0';
        local_70 = lcQpaXcbWindow::category.name;
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<(&local_68,"void QXcbWindow::updateWmTransientFor()");
        local_60 = pQVar4->stream;
        *(int *)(local_60 + 0x28) = *(int *)(local_60 + 0x28) + 1;
        ::operator<<((Stream *)local_58,(QPlatformSurface *)&local_60);
        pQVar4 = QDebug::operator<<((QDebug *)local_58," registerWmTransientForChild ");
        local_50 = pQVar4->stream;
        *(int *)(local_50 + 0x28) = *(int *)(local_50 + 0x28) + 1;
        ::operator<<((Stream *)local_48,(QPlatformSurface *)&local_50);
        QDebug::~QDebug((QDebug *)local_48);
        QDebug::~QDebug((QDebug *)&local_50);
        QDebug::~QDebug((QDebug *)local_58);
        QDebug::~QDebug((QDebug *)&local_60);
        QDebug::~QDebug(&local_68);
        if (transientXcbParent == 0) goto LAB_0016a8d1;
      }
    }
    xcb_change_property((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                        m_xcbConnection,0,this->m_window,0x44,0x21,0x20,1,&transientXcbParent);
    lcQpaXcbWindow();
    if (((byte)lcQpaXcbWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_88[0] = '\x02';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = '\0';
      local_88[9] = '\0';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_70 = lcQpaXcbWindow::category.name;
      QMessageLogger::debug
                (local_88,"0x%x added XCB_ATOM_WM_TRANSIENT_FOR 0x%x",(ulong)this->m_window);
    }
    if (transientXcbParent != 0) goto LAB_0016a969;
  }
  else {
    iVar1 = QWindow::type();
    if (iVar1 == 5) goto LAB_0016a794;
    iVar1 = QWindow::type();
    if (iVar1 == 0xb) goto LAB_0016a794;
    iVar1 = QWindow::type();
    if (iVar1 == 0xf) goto LAB_0016a794;
    iVar1 = QWindow::type();
    if (iVar1 == 0xd) goto LAB_0016a794;
    iVar1 = QWindow::type();
    if (iVar1 == 7) goto LAB_0016a794;
    iVar1 = QWindow::type();
    if (iVar1 == 9) goto LAB_0016a794;
  }
LAB_0016a956:
  xcb_delete_property((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                      m_xcbConnection,this->m_window,0x44);
LAB_0016a969:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbWindow::updateWmTransientFor()
{
    xcb_window_t transientXcbParent = XCB_NONE;
    if (isTransient(window())) {
        QWindow *tp = window()->transientParent();
        if (tp && tp->handle()) {
            QXcbWindow *handle = static_cast<QXcbWindow *>(tp->handle());
            transientXcbParent = tp->handle()->winId();
            if (transientXcbParent) {
                handle->registerWmTransientForChild(this);
                qCDebug(lcQpaXcbWindow) << Q_FUNC_INFO << static_cast<QPlatformWindow *>(handle)
                    << " registerWmTransientForChild " << static_cast<QPlatformWindow *>(this);
            }
        }
        // Default to client leader if there is no transient parent, else modal dialogs can
        // be hidden by their parents.
        if (!transientXcbParent)
            transientXcbParent = connection()->clientLeader();
        if (transientXcbParent) { // ICCCM 4.1.2.6
            xcb_change_property(xcb_connection(), XCB_PROP_MODE_REPLACE, m_window,
                                XCB_ATOM_WM_TRANSIENT_FOR, XCB_ATOM_WINDOW, 32,
                                1, &transientXcbParent);
            qCDebug(lcQpaXcbWindow, "0x%x added XCB_ATOM_WM_TRANSIENT_FOR 0x%x", m_window, transientXcbParent);
        }
    }
    if (!transientXcbParent)
        xcb_delete_property(xcb_connection(), m_window, XCB_ATOM_WM_TRANSIENT_FOR);
}